

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

int map_set_key_size_function(map *map,map_key_size_function_t function)

{
  int iVar1;
  
  if (map->bucket_count == 0) {
    map->key_size_function = function;
    iVar1 = 0;
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int map_set_key_size_function(struct map *map, map_key_size_function_t function)
{
        if (map->bucket_count > 0) {
                // Since we have already added entries to the map we can't
                // change how we determine key size.
                return -1;
        }

        map->key_size_function = function;

        return 0;
}